

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O0

string_t duckdb::BinaryHugeIntOperator::Operation<duckdb::hugeint_t,duckdb::string_t>
                   (hugeint_t input,Vector *result)

{
  hugeint_t value;
  idx_t iVar1;
  string_t *this;
  int64_t in_RDX;
  uint64_t in_RSI;
  duckdb *in_RDI;
  idx_t in_R8;
  hugeint_t in;
  hugeint_t x;
  char *output;
  char *output_1;
  idx_t buffer_size;
  idx_t num_leading_zero;
  string_t target;
  idx_t in_stack_ffffffffffffff88;
  Vector *in_stack_ffffffffffffff90;
  int64_t in_stack_ffffffffffffff98;
  string_t *in_stack_ffffffffffffffa0;
  anon_union_16_2_67f50693_for_value local_10;
  
  in.upper = in_RDX;
  in.lower = in_RSI;
  UnsafeNumericCast<duckdb::hugeint_t,duckdb::hugeint_t,void>(in_RDI,in);
  value.upper = in_stack_ffffffffffffff98;
  value.lower = (uint64_t)in_stack_ffffffffffffff90;
  iVar1 = CountZeros<duckdb::hugeint_t>::Leading(value);
  if ((char **)(0x80 - iVar1) == (char **)0x0) {
    local_10.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         StringVector::EmptyString(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    this = (string_t *)string_t::GetDataWriteable((string_t *)in_stack_ffffffffffffff90);
    *(undefined1 *)&this->value = 0x30;
    string_t::Finalize(this);
  }
  else {
    local_10.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         StringVector::EmptyString(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    string_t::GetDataWriteable((string_t *)in_stack_ffffffffffffff90);
    x.upper = (int64_t)&stack0xffffffffffffff98;
    x.lower = in_RSI;
    WriteHugeIntBinBytes<duckdb::hugeint_t>(in_RDI,x,(char **)(0x80 - iVar1),in_R8);
    string_t::Finalize(in_stack_ffffffffffffffa0);
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_10.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto num_leading_zero = CountZeros<hugeint_t>::Leading(UnsafeNumericCast<hugeint_t>(input));
		idx_t buffer_size = sizeof(INPUT_TYPE) * 8 - num_leading_zero;

		// Special case: All bits are zero
		if (buffer_size == 0) {
			auto target = StringVector::EmptyString(result, 1);
			auto output = target.GetDataWriteable();
			*output = '0';
			target.Finalize();
			return target;
		}

		auto target = StringVector::EmptyString(result, buffer_size);
		auto output = target.GetDataWriteable();

		WriteHugeIntBinBytes<hugeint_t>(input, output, buffer_size);

		target.Finalize();
		return target;
	}